

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

r_code * __thiscall r_code::ReadString_abi_cxx11_(r_code *this,uint32_t *data)

{
  long local_30;
  size_t i;
  char *content;
  uint32_t *data_local;
  string *ret;
  
  std::__cxx11::string::string((string *)this);
  for (local_30 = 0; *(char *)((long)data + local_30 + 4) != '\0'; local_30 = local_30 + 1) {
    std::__cxx11::string::operator+=((string *)this,*(char *)((long)data + local_30 + 4));
  }
  return this;
}

Assistant:

std::string ReadString(uint32_t *data)
{
    std::string ret;
    char *content = (char *)(data + 1);

    for (size_t i = 0; content[i] != 0; ++i) {
        ret += content[i];
    }

    return ret;
}